

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

connectdata * Curl_conncache_extract_bundle(Curl_easy *data,connectbundle *bundle)

{
  connectdata *pcVar1;
  conncache *pcVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  timediff_t tVar5;
  curltime cVar6;
  curltime newer;
  curltime older;
  connectdata *conn;
  connectdata *conn_candidate;
  curltime now;
  timediff_t score;
  timediff_t highscore;
  Curl_llist_element *curr;
  connectbundle *bundle_local;
  Curl_easy *data_local;
  
  score = -1;
  conn = (connectdata *)0x0;
  cVar6 = Curl_now();
  for (highscore = (timediff_t)(bundle->conn_list).head; highscore != 0;
      highscore = *(timediff_t *)(highscore + 0x10)) {
    pcVar1 = *(connectdata **)highscore;
    if (((pcVar1->easyq).size == 0) &&
       (uVar3 = (pcVar1->lastused).tv_sec, uVar4 = (pcVar1->lastused).tv_usec, older.tv_usec = uVar4
       , older.tv_sec = uVar3, newer._12_4_ = 0, newer.tv_sec = SUB128(cVar6._0_12_,0),
       newer.tv_usec = SUB124(cVar6._0_12_,8), older._12_4_ = 0, tVar5 = Curl_timediff(newer,older),
       score < tVar5)) {
      conn = pcVar1;
      score = tVar5;
    }
  }
  if (conn != (connectdata *)0x0) {
    bundle_remove_conn(bundle,conn);
    pcVar2 = (data->state).conn_cache;
    pcVar2->num_conn = pcVar2->num_conn - 1;
  }
  return conn;
}

Assistant:

struct connectdata *
Curl_conncache_extract_bundle(struct Curl_easy *data,
                              struct connectbundle *bundle)
{
  struct Curl_llist_element *curr;
  timediff_t highscore = -1;
  timediff_t score;
  struct curltime now;
  struct connectdata *conn_candidate = NULL;
  struct connectdata *conn;

  (void)data;

  now = Curl_now();

  curr = bundle->conn_list.head;
  while(curr) {
    conn = curr->ptr;

    if(!CONN_INUSE(conn)) {
      /* Set higher score for the age passed since the connection was used */
      score = Curl_timediff(now, conn->lastused);

      if(score > highscore) {
        highscore = score;
        conn_candidate = conn;
      }
    }
    curr = curr->next;
  }
  if(conn_candidate) {
    /* remove it to prevent another thread from nicking it */
    bundle_remove_conn(bundle, conn_candidate);
    data->state.conn_cache->num_conn--;
    DEBUGF(infof(data, "The cache now contains %zu members",
                 data->state.conn_cache->num_conn));
  }

  return conn_candidate;
}